

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 extraout_EAX;
  uint uVar7;
  uint uVar8;
  parasail_result_t *result;
  __m128i *palVar9;
  __m128i *palVar10;
  __m128i *b;
  uint uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  ulong uVar15;
  char *__format;
  int iVar16;
  undefined8 in_R9;
  int iVar17;
  __m128i *palVar18;
  long lVar19;
  __m128i *palVar20;
  ulong uVar21;
  ulong size;
  int iVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i alVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i c;
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffec8;
  ulong local_130;
  uint local_124;
  ulong local_118;
  __m128i *local_110;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "profile";
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "profile->profile32.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar14 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar14 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar14 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar14 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar14 = "open";
        }
        else {
          if (-1 < gap) {
            uVar11 = 0x7ffffffe - ppVar4->max;
            uVar21 = (ulong)uVar11;
            result = parasail_result_new_table1((uint)((ulong)uVar2 + 3) & 0x7ffffffc,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = (ulong)uVar2 + 3 >> 2;
              result->flag = result->flag | 0x4420804;
              palVar9 = parasail_memalign___m128i(0x10,size);
              palVar10 = parasail_memalign___m128i(0x10,size);
              local_110 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              auVar24._0_4_ = -(uint)((int)palVar9 == 0 && (int)((ulong)palVar9 >> 0x20) == 0);
              auVar24._4_4_ = -(uint)((int)palVar10 == 0 && (int)((ulong)palVar10 >> 0x20) == 0);
              auVar24._8_4_ = -(uint)((int)local_110 == 0 && (int)((ulong)local_110 >> 0x20) == 0);
              auVar24._12_4_ = -(uint)((int)b == 0 && (int)((ulong)b >> 0x20) == 0);
              iVar12 = movmskps((int)uVar21,auVar24);
              len = CONCAT44((int)(uVar21 >> 0x20),iVar12);
              if (iVar12 == 0) {
                local_118 = 0;
                alVar34[1] = extraout_RDX;
                alVar34[0] = size;
                parasail_memset___m128i(palVar9,alVar34,len);
                c[1] = extraout_RDX_00;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                uVar5 = (uint)size;
                uVar8 = 0xc0000000;
                uVar23 = 0xc0000000;
                uVar30 = 0xc0000000;
                uVar35 = 0xc0000000;
                local_108 = 0xc0000000;
                uStack_104 = 0xc0000000;
                uStack_100 = 0xc0000000;
                uStack_fc = 0xc0000000;
                local_124 = 0xc0000000;
                uVar21 = 0;
                do {
                  palVar18 = palVar9;
                  local_130 = (ulong)(uint)s2Len;
                  if (uVar21 == (uint)s2Len) {
LAB_00565694:
                    if (local_124 == 0x7fffffff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar12 = parasail_result_is_saturated(result);
                    palVar9 = local_110;
                    if (iVar12 == 0) {
                      iVar13 = (int)local_130 + -1;
                      iVar12 = (int)local_130 + -2;
                      if ((int)local_118 == iVar12) {
                        palVar9 = palVar10;
                      }
                      if ((int)local_118 == iVar13) {
                        palVar9 = palVar18;
                        palVar18 = local_110;
                      }
                      iVar17 = uVar2 - 1;
                      for (uVar21 = 0; (uVar5 & 0x1fffffff) << 2 != (uint)uVar21;
                          uVar21 = uVar21 + 1) {
                        if ((*(uint *)((long)*palVar9 + uVar21 * 4) == local_124) &&
                           (iVar16 = ((uint)uVar21 & 3) * uVar5 + ((uint)(uVar21 >> 2) & 0x3fffffff)
                           , iVar16 < iVar17)) {
                          iVar17 = iVar16;
                        }
                      }
                      if ((int)local_118 != iVar12) {
                        local_110 = palVar10;
                      }
                      if ((int)local_118 != iVar13) {
                        palVar10 = local_110;
                      }
                    }
                    else {
                      local_118._0_4_ = 0;
                      local_124 = 0x7fffffff;
                      iVar17 = 0;
                    }
                    result->score = local_124;
                    result->end_query = iVar17;
                    result->end_ref = (int)local_118;
                    parasail_free(b);
                    parasail_free(palVar9);
                    parasail_free(palVar10);
                    parasail_free(palVar18);
                    return result;
                  }
                  palVar18 = palVar9 + (uVar5 - 1);
                  iVar17 = (int)(*palVar18)[0];
                  iVar16 = *(int *)((long)*palVar18 + 4);
                  iVar39 = (int)(*palVar18)[1];
                  iVar12 = ppVar4->mapper[(byte)s2[uVar21]];
                  iVar13 = (int)uVar21;
                  palVar18 = palVar10;
                  if ((int)local_118 == iVar13 + -2) {
                    palVar18 = local_110;
                  }
                  iVar22 = 0;
                  auVar37 = (undefined1  [16])0x0;
                  lVar19 = 0;
                  for (uVar15 = 0; size != uVar15; uVar15 = uVar15 + 1) {
                    piVar1 = (int *)((long)pvVar3 + lVar19 + (long)(int)(iVar12 * uVar5) * 0x10);
                    auVar32._0_4_ = iVar22 + *piVar1;
                    auVar32._4_4_ = iVar17 + piVar1[1];
                    auVar32._8_4_ = iVar16 + piVar1[2];
                    auVar32._12_4_ = iVar39 + piVar1[3];
                    auVar24 = *(undefined1 (*) [16])((long)*b + lVar19);
                    auVar31._0_4_ = -(uint)(auVar24._0_4_ < auVar32._0_4_);
                    auVar31._4_4_ = -(uint)(auVar24._4_4_ < auVar32._4_4_);
                    auVar31._8_4_ = -(uint)(auVar24._8_4_ < auVar32._8_4_);
                    auVar31._12_4_ = -(uint)(auVar24._12_4_ < auVar32._12_4_);
                    auVar32 = ~auVar31 & auVar24 | auVar32 & auVar31;
                    auVar36._0_4_ = -(uint)(auVar37._0_4_ < auVar32._0_4_);
                    auVar36._4_4_ = -(uint)(auVar37._4_4_ < auVar32._4_4_);
                    auVar36._8_4_ = -(uint)(auVar37._8_4_ < auVar32._8_4_);
                    auVar36._12_4_ = -(uint)(auVar37._12_4_ < auVar32._12_4_);
                    auVar32 = ~auVar36 & auVar37 | auVar32 & auVar36;
                    auVar25._0_4_ = -(uint)(0 < auVar32._0_4_);
                    auVar25._4_4_ = -(uint)(0 < auVar32._4_4_);
                    auVar25._8_4_ = -(uint)(0 < auVar32._8_4_);
                    auVar25._12_4_ = -(uint)(0 < auVar32._12_4_);
                    auVar25 = auVar25 & auVar32;
                    *(undefined1 (*) [16])((long)*palVar18 + lVar19) = auVar25;
                    vH[0] = uVar15 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((result->field_4).rowcols)->score_row,vH,iVar13,s2Len,
                                    (int32_t)in_R9,in_stack_fffffffffffffec8);
                    local_48 = auVar25._0_4_;
                    uStack_44 = auVar25._4_4_;
                    uStack_40 = auVar25._8_4_;
                    uStack_3c = auVar25._12_4_;
                    local_108 = ~-(uint)((int)local_108 < (int)local_48) & local_108 |
                                local_48 & -(uint)((int)local_108 < (int)local_48);
                    uStack_104 = ~-(uint)((int)uStack_104 < (int)uStack_44) & uStack_104 |
                                 uStack_44 & -(uint)((int)uStack_104 < (int)uStack_44);
                    uStack_100 = ~-(uint)((int)uStack_100 < (int)uStack_40) & uStack_100 |
                                 uStack_40 & -(uint)((int)uStack_100 < (int)uStack_40);
                    uStack_fc = ~-(uint)((int)uStack_fc < (int)uStack_3c) & uStack_fc |
                                uStack_3c & -(uint)((int)uStack_fc < (int)uStack_3c);
                    auVar41._0_4_ = local_48 - open;
                    auVar41._4_4_ = uStack_44 - open;
                    auVar41._8_4_ = uStack_40 - open;
                    auVar41._12_4_ = uStack_3c - open;
                    auVar40._0_4_ = auVar24._0_4_ - gap;
                    auVar40._4_4_ = auVar24._4_4_ - gap;
                    auVar40._8_4_ = auVar24._8_4_ - gap;
                    auVar40._12_4_ = auVar24._12_4_ - gap;
                    auVar26._0_4_ = -(uint)(auVar41._0_4_ < auVar40._0_4_);
                    auVar26._4_4_ = -(uint)(auVar41._4_4_ < auVar40._4_4_);
                    auVar26._8_4_ = -(uint)(auVar41._8_4_ < auVar40._8_4_);
                    auVar26._12_4_ = -(uint)(auVar41._12_4_ < auVar40._12_4_);
                    *(undefined1 (*) [16])((long)*b + lVar19) =
                         ~auVar26 & auVar41 | auVar40 & auVar26;
                    auVar38._0_4_ = auVar37._0_4_ - gap;
                    auVar38._4_4_ = auVar37._4_4_ - gap;
                    auVar38._8_4_ = auVar37._8_4_ - gap;
                    auVar38._12_4_ = auVar37._12_4_ - gap;
                    auVar27._0_4_ = -(uint)(auVar41._0_4_ < auVar38._0_4_);
                    auVar27._4_4_ = -(uint)(auVar41._4_4_ < auVar38._4_4_);
                    auVar27._8_4_ = -(uint)(auVar41._8_4_ < auVar38._8_4_);
                    auVar27._12_4_ = -(uint)(auVar41._12_4_ < auVar38._12_4_);
                    auVar37 = auVar38 & auVar27 | ~auVar27 & auVar41;
                    piVar1 = (int *)((long)*palVar9 + lVar19);
                    iVar22 = *piVar1;
                    iVar17 = piVar1[1];
                    iVar16 = piVar1[2];
                    iVar39 = piVar1[3];
                    lVar19 = lVar19 + 0x10;
                  }
                  if ((int)local_118 == iVar13 + -2) {
                    local_110 = palVar10;
                  }
                  palVar10 = local_110;
                  for (iVar12 = 0; uVar6 = SUB84(palVar10,0), iVar12 != 4; iVar12 = iVar12 + 1) {
                    lVar19 = auVar37._8_8_;
                    uVar15 = auVar37._0_8_;
                    auVar37._0_8_ = uVar15 << 0x20;
                    auVar37._8_8_ = lVar19 << 0x20 | uVar15 >> 0x20;
                    palVar20 = palVar18;
                    for (uVar15 = 0; size != uVar15; uVar15 = uVar15 + 1) {
                      alVar34 = *palVar20;
                      auVar33._0_4_ = -(uint)(auVar37._0_4_ < (int)alVar34[0]);
                      iVar17 = auVar37._4_4_;
                      auVar33._4_4_ = -(uint)(iVar17 < alVar34[0]._4_4_);
                      iVar16 = auVar37._8_4_;
                      auVar33._8_4_ = -(uint)(iVar16 < (int)alVar34[1]);
                      iVar39 = auVar37._12_4_;
                      auVar33._12_4_ = -(uint)(iVar39 < alVar34[1]._4_4_);
                      alVar34 = (__m128i)(~auVar33 & auVar37 | (undefined1  [16])alVar34 & auVar33);
                      *palVar20 = alVar34;
                      vH_00[0] = uVar15 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((result->field_4).rowcols)->score_row,vH_00,iVar13,s2Len,
                                      (int32_t)in_R9,in_stack_fffffffffffffec8);
                      local_c8 = (uint)alVar34[0];
                      uStack_c4 = alVar34[0]._4_4_;
                      uStack_c0 = (uint)alVar34[1];
                      uStack_bc = alVar34[1]._4_4_;
                      local_108 = ~-(uint)((int)local_108 < (int)local_c8) & local_108 |
                                  local_c8 & -(uint)((int)local_108 < (int)local_c8);
                      uStack_104 = ~-(uint)((int)uStack_104 < (int)uStack_c4) & uStack_104 |
                                   uStack_c4 & -(uint)((int)uStack_104 < (int)uStack_c4);
                      uStack_100 = ~-(uint)((int)uStack_100 < (int)uStack_c0) & uStack_100 |
                                   uStack_c0 & -(uint)((int)uStack_100 < (int)uStack_c0);
                      uStack_fc = ~-(uint)((int)uStack_fc < (int)uStack_bc) & uStack_fc |
                                  uStack_bc & -(uint)((int)uStack_fc < (int)uStack_bc);
                      auVar37._0_4_ = auVar37._0_4_ - gap;
                      auVar37._4_4_ = iVar17 - gap;
                      auVar37._8_4_ = iVar16 - gap;
                      auVar37._12_4_ = iVar39 - gap;
                      auVar28._0_4_ = -(uint)((int)(local_c8 - open) < auVar37._0_4_);
                      auVar28._4_4_ = -(uint)((int)(uStack_c4 - open) < auVar37._4_4_);
                      auVar28._8_4_ = -(uint)((int)(uStack_c0 - open) < auVar37._8_4_);
                      auVar28._12_4_ = -(uint)((int)(uStack_bc - open) < auVar37._12_4_);
                      uVar7 = movmskps(extraout_EAX,auVar28);
                      palVar10 = (__m128i *)(ulong)uVar7;
                      if (uVar7 == 0) {
                        uVar6 = 0;
                        goto LAB_005655b6;
                      }
                      palVar20 = palVar20 + 1;
                    }
                  }
LAB_005655b6:
                  auVar29._0_4_ = -(uint)((int)uVar8 < (int)local_108);
                  auVar29._4_4_ = -(uint)((int)uVar23 < (int)uStack_104);
                  auVar29._8_4_ = -(uint)((int)uVar30 < (int)uStack_100);
                  auVar29._12_4_ = -(uint)((int)uVar35 < (int)uStack_fc);
                  iVar12 = movmskps(uVar6,auVar29);
                  palVar10 = palVar9;
                  if (iVar12 != 0) {
                    uVar30 = ~-(uint)((int)uStack_100 < (int)local_108) & uStack_100 |
                             local_108 & -(uint)((int)uStack_100 < (int)local_108);
                    uVar35 = ~-(uint)((int)uStack_fc < (int)uStack_104) & uStack_fc |
                             uStack_104 & -(uint)((int)uStack_fc < (int)uStack_104);
                    uVar23 = -(uint)((int)uVar35 < (int)uVar30);
                    uVar8 = ~uVar23 & uVar35 | uVar30 & uVar23;
                    local_124 = uVar8;
                    if ((int)uVar11 < (int)uVar8) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_130 = uVar21;
                      goto LAB_00565694;
                    }
                    local_118 = uVar21 & 0xffffffff;
                    uVar23 = uVar8;
                    uVar30 = uVar8;
                    uVar35 = uVar8;
                  }
                  uVar21 = uVar21 + 1;
                  palVar9 = palVar18;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar14 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_sse2_128_32",pcVar14);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}